

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_pcallk(lua_State *L,int nargs,int nresults,int errfunc,lua_KContext ctx,lua_KFunction k)

{
  CallInfo *pCVar1;
  int iVar2;
  TValue *pTVar3;
  CallInfo *ci;
  StkId o;
  ptrdiff_t func;
  StkId pTStack_40;
  int status;
  CallS c;
  lua_KFunction k_local;
  lua_KContext ctx_local;
  int errfunc_local;
  int nresults_local;
  int nargs_local;
  lua_State *L_local;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  c._8_8_ = k;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x50f,"int lua_pcallk(lua_State *, int, int, int, lua_KContext, lua_KFunction)");
  }
  if ((k != (lua_KFunction)0x0) && ((L->ci->callstatus & 2) != 0)) {
    __assert_fail("(k == ((void*)0) || !((L->ci)->callstatus & (1<<1))) && \"cannot use continuations inside hooks\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x511,"int lua_pcallk(lua_State *, int, int, int, lua_KContext, lua_KFunction)");
  }
  if ((long)L->top - (long)L->ci->func >> 4 <= (long)(nargs + 1)) {
    __assert_fail("((nargs+1) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x512,"int lua_pcallk(lua_State *, int, int, int, lua_KContext, lua_KFunction)");
  }
  if (L->status != '\0') {
    __assert_fail("(L->status == 0) && \"cannot do calls on non-normal thread\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x513,"int lua_pcallk(lua_State *, int, int, int, lua_KContext, lua_KFunction)");
  }
  if ((nresults != -1) && ((long)L->ci->top - (long)L->top >> 4 < (long)(nresults - nargs))) {
    __assert_fail("((nresults) == (-1) || (L->ci->top - L->top >= (nresults) - (nargs))) && \"results from function overflow current stack size\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x514,"int lua_pcallk(lua_State *, int, int, int, lua_KContext, lua_KFunction)");
  }
  if (errfunc == 0) {
    o = (StkId)0x0;
  }
  else {
    pTVar3 = index2addr(L,errfunc);
    if ((pTVar3 == &luaO_nilobject_) || (errfunc < -0xf4627)) {
      __assert_fail("((((o) != (&luaO_nilobject_)) && !((errfunc) <= (-1000000 - 1000)))) && \"index not in the stack\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x519,"int lua_pcallk(lua_State *, int, int, int, lua_KContext, lua_KFunction)"
                   );
    }
    o = (StkId)((long)pTVar3 - (long)L->stack);
  }
  pTStack_40 = L->top + -(long)(nargs + 1);
  if ((c._8_8_ == 0) || (L->nny != 0)) {
    c.func._0_4_ = nresults;
    func._4_4_ = luaD_pcall(L,f_call,&stack0xffffffffffffffc0,(long)pTStack_40 - (long)L->stack,
                            (ptrdiff_t)o);
  }
  else {
    pCVar1 = L->ci;
    (pCVar1->u).l.base = (StkId)c._8_8_;
    (pCVar1->u).c.ctx = ctx;
    pCVar1->extra = (long)pTStack_40 - (long)L->stack;
    (pCVar1->u).l.savedpc = (Instruction *)L->errfunc;
    L->errfunc = (ptrdiff_t)o;
    pCVar1->callstatus = pCVar1->callstatus & 0xfffe | (ushort)L->allowhook;
    pCVar1->callstatus = pCVar1->callstatus | 0x10;
    luaD_call(L,pTStack_40,nresults);
    pCVar1->callstatus = pCVar1->callstatus & 0xffef;
    L->errfunc = (ptrdiff_t)(pCVar1->u).l.savedpc;
    func._4_4_ = 0;
  }
  if ((nresults == -1) && (L->ci->top < L->top)) {
    L->ci->top = L->top;
  }
  iVar2 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar2;
  if (iVar2 != 0) {
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x531,"int lua_pcallk(lua_State *, int, int, int, lua_KContext, lua_KFunction)");
  }
  return func._4_4_;
}

Assistant:

LUA_API int lua_pcallk (lua_State *L, int nargs, int nresults, int errfunc,
                        lua_KContext ctx, lua_KFunction k) {
  struct CallS c;
  int status;
  ptrdiff_t func;
  lua_lock(L);
  api_check(L, k == NULL || !isLua(L->ci),
    "cannot use continuations inside hooks");
  api_checknelems(L, nargs+1);
  api_check(L, L->status == LUA_OK, "cannot do calls on non-normal thread");
  checkresults(L, nargs, nresults);
  if (errfunc == 0)
    func = 0;
  else {
    StkId o = index2addr(L, errfunc);
    api_checkstackindex(L, errfunc, o);
    func = savestack(L, o);
  }
  c.func = L->top - (nargs+1);  /* function to be called */
  if (k == NULL || L->nny > 0) {  /* no continuation or no yieldable? */
    c.nresults = nresults;  /* do a 'conventional' protected call */
    status = luaD_pcall(L, f_call, &c, savestack(L, c.func), func);
  }
  else {  /* prepare continuation (call is already protected by 'resume') */
    CallInfo *ci = L->ci;
    ci->u.c.k = k;  /* save continuation */
    ci->u.c.ctx = ctx;  /* save context */
    /* save information for error recovery */
    ci->extra = savestack(L, c.func);
    ci->u.c.old_errfunc = L->errfunc;
    L->errfunc = func;
    setoah(ci->callstatus, L->allowhook);  /* save value of 'allowhook' */
    ci->callstatus |= CIST_YPCALL;  /* function can do error recovery */
    luaD_call(L, c.func, nresults);  /* do the call */
    ci->callstatus &= ~CIST_YPCALL;
    L->errfunc = ci->u.c.old_errfunc;
    status = LUA_OK;  /* if it is here, there were no errors */
  }
  adjustresults(L, nresults);
  lua_unlock(L);
  return status;
}